

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

void rf_draw_ring(rf_vec2 center,float inner_radius,float outer_radius,int start_angle,int end_angle
                 ,int segments,rf_color color)

{
  rf_render_batch *prVar1;
  rf_vertex_buffer *prVar2;
  int iVar3;
  long lVar4;
  int end_angle_00;
  float fVar5;
  float fVar6;
  float fVar7;
  float __x;
  float radius;
  float local_7c;
  float local_68;
  float fStack_64;
  
  if (start_angle == end_angle) {
    return;
  }
  radius = (float)(~-(uint)(outer_radius < inner_radius) & (uint)outer_radius |
                  (~-(uint)(0.0 < inner_radius) & 0x3dcccccd |
                  -(uint)(0.0 < inner_radius) & (uint)inner_radius) &
                  -(uint)(outer_radius < inner_radius));
  end_angle_00 = start_angle;
  if (start_angle < end_angle) {
    end_angle_00 = end_angle;
  }
  if (inner_radius <= outer_radius) {
    outer_radius = inner_radius;
  }
  if (end_angle < start_angle) {
    start_angle = end_angle;
  }
  if (segments < 4) {
    fVar5 = -0.5 / radius + 1.0;
    fVar5 = fVar5 * fVar5;
    fVar5 = acosf(fVar5 + fVar5 + -1.0);
    fVar5 = ceilf(6.2831855 / fVar5);
    iVar3 = (int)((fVar5 * (float)(end_angle_00 - start_angle)) / 360.0);
    segments = 4;
    if (0 < iVar3) {
      segments = iVar3;
    }
  }
  if (0.0 < outer_radius) {
    prVar1 = (rf__ctx->field_0).current_batch;
    lVar4 = prVar1->current_buffer;
    prVar2 = prVar1->vertex_buffers;
    if (prVar2[lVar4].elements_count * 4 <= segments * 6 + prVar2[lVar4].v_counter) {
      rf_gfx_draw();
    }
    rf_gfx_begin(RF_TRIANGLES);
    if (0 < segments) {
      local_7c = (float)start_angle;
      lVar4 = (long)segments;
      fStack_64 = center.y;
      do {
        rf_gfx_color4ub(color.r,color.g,color.b,color.a);
        __x = local_7c * 0.017453292;
        fVar5 = sinf(__x);
        local_68 = center.x;
        fVar6 = cosf(__x);
        rf_gfx_vertex3f(fVar5 * outer_radius + local_68,fVar6 * outer_radius + fStack_64,
                        ((rf__ctx->field_0).current_batch)->current_depth);
        fVar5 = sinf(__x);
        fVar6 = cosf(__x);
        rf_gfx_vertex3f(fVar5 * radius + local_68,fVar6 * radius + fStack_64,
                        ((rf__ctx->field_0).current_batch)->current_depth);
        local_7c = local_7c + (float)(end_angle_00 - start_angle) / (float)segments;
        fVar5 = local_7c * 0.017453292;
        fVar6 = sinf(fVar5);
        fVar7 = cosf(fVar5);
        rf_gfx_vertex3f(fVar6 * outer_radius + local_68,fVar7 * outer_radius + fStack_64,
                        ((rf__ctx->field_0).current_batch)->current_depth);
        fVar6 = sinf(fVar5);
        fVar7 = cosf(fVar5);
        rf_gfx_vertex3f(fVar6 * outer_radius + local_68,fVar7 * outer_radius + fStack_64,
                        ((rf__ctx->field_0).current_batch)->current_depth);
        fVar6 = sinf(__x);
        fVar7 = cosf(__x);
        rf_gfx_vertex3f(fVar6 * radius + local_68,fVar7 * radius + fStack_64,
                        ((rf__ctx->field_0).current_batch)->current_depth);
        fVar6 = sinf(fVar5);
        fVar5 = cosf(fVar5);
        rf_gfx_vertex3f(fVar6 * radius + local_68,fVar5 * radius + fStack_64,
                        ((rf__ctx->field_0).current_batch)->current_depth);
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
    rf_gfx_end();
    return;
  }
  rf_draw_circle_sector(center,radius,start_angle,end_angle_00,segments,color);
  return;
}

Assistant:

RF_API void rf_draw_ring(rf_vec2 center, float inner_radius, float outer_radius, int start_angle, int end_angle, int segments, rf_color color)
{
    if (start_angle == end_angle) return;

    // Function expects (outerRadius > innerRadius)
    if (outer_radius < inner_radius)
    {
        float tmp = outer_radius;
        outer_radius = inner_radius;
        inner_radius = tmp;

        if (outer_radius <= 0.0f) outer_radius = 0.1f;
    }

    // Function expects (endAngle > start_angle)
    if (end_angle < start_angle)
    {
        // Swap values
        int tmp = start_angle;
        start_angle = end_angle;
        end_angle = tmp;
    }

    if (segments < 4)
    {
        // Calculate how many segments we need to draw a smooth circle, taken from https://stackoverflow.com/a/2244088

        float CIRCLE_ERROR_RATE = 0.5f;

        // Calculate the maximum angle between segments based on the error rate.
        float th = acosf(2*powf(1 - CIRCLE_ERROR_RATE/outer_radius, 2) - 1);
        segments = (end_angle - start_angle) * ceilf(2 * RF_PI / th) / 360;

        if (segments <= 0) segments = 4;
    }

    // Not a ring
    if (inner_radius <= 0.0f)
    {
        rf_draw_circle_sector(center, outer_radius, start_angle, end_angle, segments, color);
        return;
    }

    float step_length = (float)(end_angle - start_angle)/(float)segments;
    float angle = start_angle;
    if (rf_gfx_check_buffer_limit(6*segments)) rf_gfx_draw();

    rf_gfx_begin(RF_TRIANGLES);
    for (rf_int i = 0; i < segments; i++)
    {
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);

        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*inner_radius, center.y + cosf(RF_DEG2RAD*angle)*inner_radius);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*outer_radius, center.y + cosf(RF_DEG2RAD*angle)*outer_radius);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*inner_radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*inner_radius);

        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*inner_radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*inner_radius);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*outer_radius, center.y + cosf(RF_DEG2RAD*angle)*outer_radius);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*outer_radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*outer_radius);

        angle += step_length;
    }
    rf_gfx_end();

}